

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O2

void Abc_NtkCollectNodesByArea(SC_Man *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Que_t *pVVar2;
  int *piVar3;
  Vec_Flt_t *pVVar4;
  uint __line;
  int iVar5;
  Abc_Obj_t *p_00;
  SC_Cell *pSVar6;
  ulong uVar7;
  long lVar8;
  char *__assertion;
  
  iVar5 = Vec_QueSize(p->vNodeByGain);
  if (iVar5 != 0) {
    __assert_fail("Vec_QueSize(p->vNodeByGain) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclDnsize.c"
                  ,0xb5,"void Abc_NtkCollectNodesByArea(SC_Man *, Abc_Ntk_t *)");
  }
  pVVar2 = p->vNodeByGain;
  piVar3 = pVVar2->pHeap;
  if (*piVar3 == -1) {
    uVar7 = 1;
    while( true ) {
      if ((long)pVVar2->nSize <= (long)uVar7) {
        pVVar2->nSize = 1;
        iVar5 = 0;
        do {
          if (pNtk->vObjs->nSize <= iVar5) {
            return;
          }
          p_00 = Abc_NtkObj(pNtk,iVar5);
          if (((p_00 != (Abc_Obj_t *)0x0) && ((*(uint *)&p_00->field_0x14 & 0xf) == 7)) &&
             (0 < (p_00->vFanins).nSize)) {
            pVVar4 = p->vNode2Gain;
            iVar1 = p_00->Id;
            pSVar6 = Abc_SclObjCell(p_00);
            if (((long)iVar1 < 0) || (pVVar4->nSize <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                            ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
            }
            pVVar4->pArray[iVar1] = pSVar6->area;
            Vec_QuePush(p->vNodeByGain,p_00->Id);
          }
          iVar5 = iVar5 + 1;
        } while( true );
      }
      lVar8 = (long)piVar3[uVar7];
      if ((lVar8 < 0) || (uVar7 != (uint)pVVar2->pOrder[lVar8])) break;
      pVVar2->pOrder[lVar8] = -1;
      piVar3[uVar7] = -1;
      uVar7 = uVar7 + 1;
    }
    __assertion = "p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i";
    __line = 0x74;
  }
  else {
    __assertion = "p->pHeap[0] == -1";
    __line = 0x71;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,__line,"void Vec_QueClear(Vec_Que_t *)");
}

Assistant:

void Abc_NtkCollectNodesByArea( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_QueSize(p->vNodeByGain) == 0 );
    Vec_QueClear( p->vNodeByGain );
    Abc_NtkForEachNode( pNtk, pObj, i )
    if ( Abc_ObjFaninNum(pObj) > 0 )
    {
        Vec_FltWriteEntry( p->vNode2Gain, Abc_ObjId(pObj), Abc_SclObjCell(pObj)->area );
        Vec_QuePush( p->vNodeByGain, Abc_ObjId(pObj) );
    }
}